

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint ** Extra_TruthPerm53(void)

{
  uint uVar1;
  uint **ppuVar2;
  long lVar3;
  long lVar4;
  
  ppuVar2 = (uint **)Extra_ArrayAlloc(0x100,0x20,4);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      uVar1 = Extra_TruthPerm5One((int)lVar4 * 0x1010101,(int)lVar3);
      ppuVar2[lVar4][lVar3] = uVar1;
    }
  }
  return ppuVar2;
}

Assistant:

unsigned ** Extra_TruthPerm53()
{
    unsigned ** pTable;
    unsigned uTruth;
    int i, k;
    pTable = (unsigned **)Extra_ArrayAlloc( 256, 32, 4 );
    for ( i = 0; i < 256; i++ )
    {
        uTruth = (i << 24) | (i << 16) | (i << 8) | i;
        for ( k = 0; k < 32; k++ )
            pTable[i][k] = Extra_TruthPerm5One( uTruth, k );
    }
    return pTable;
}